

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O3

int Extra_BitMatrixIsClique(Extra_BitMat_t *pMat)

{
  uint uVar1;
  uint **ppuVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  uVar1 = pMat->nSize;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      if ((int)uVar6 < (int)uVar1) {
        ppuVar2 = pMat->ppData;
        iVar11 = pMat->nLookups;
        uVar8 = uVar6;
        do {
          iVar11 = iVar11 + 1;
          uVar13 = uVar8;
          if ((int)uVar5 < (int)uVar8) {
            uVar13 = uVar5;
          }
          uVar12 = uVar8;
          if ((int)uVar8 < (int)uVar5) {
            uVar12 = uVar5;
          }
          bVar7 = (byte)pMat->nBitShift;
          pMat->nLookups = iVar11;
          if ((ppuVar2[uVar13][uVar12 >> (bVar7 & 0x1f)] >> (pMat->uMask & uVar12 & 0x1f) & 1) != 0)
          {
            uVar13 = 0;
            do {
              if (uVar8 != uVar13 && uVar5 != uVar13) {
                pMat->nLookups = iVar11 + 1;
                uVar12 = uVar5;
                if ((int)uVar13 < (int)uVar5) {
                  uVar12 = uVar13;
                }
                uVar9 = uVar5;
                if ((int)uVar5 < (int)uVar13) {
                  uVar9 = uVar13;
                }
                uVar12 = ppuVar2[uVar12][uVar9 >> (bVar7 & 0x1f)];
                bVar4 = (byte)pMat->uMask;
                iVar11 = iVar11 + 2;
                uVar3 = uVar8;
                if ((int)uVar13 < (int)uVar8) {
                  uVar3 = uVar13;
                }
                uVar10 = uVar8;
                if ((int)uVar8 < (int)uVar13) {
                  uVar10 = uVar13;
                }
                pMat->nLookups = iVar11;
                if (((ppuVar2[uVar3][uVar10 >> (bVar7 & 0x1f)] >> ((byte)uVar10 & bVar4 & 0x1f) ^
                     uVar12 >> ((byte)uVar9 & bVar4 & 0x1f)) & 1) != 0) {
                  return 0;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar1 != uVar13);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar1);
      }
      uVar5 = uVar6;
    } while (uVar6 != uVar1);
  }
  return 1;
}

Assistant:

int Extra_BitMatrixIsClique( Extra_BitMat_t * pMat )
{
    int v, u, i;
    for ( v = 0; v < pMat->nSize; v++ )
    for ( u = v+1; u < pMat->nSize; u++ )
    {
        if ( !Extra_BitMatrixLookup1( pMat, v, u ) )
            continue;
        // v and u are symmetric
        for ( i = 0; i < pMat->nSize; i++ )
        {
            if ( i == v || i == u )
                continue;
            // i is neither v nor u
            // the symmetry status of i is the same w.r.t. to v and u
            if ( Extra_BitMatrixLookup1( pMat, i, v ) != Extra_BitMatrixLookup1( pMat, i, u ) )
                return 0;
        }
    }
    return 1;
}